

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O2

void __thiscall
Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::reserve
          (Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          size_t capacity)

{
  uint uVar1;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar2;
  ulong uVar3;
  MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *__ptr;
  
  if (this->_capacity < capacity) {
    pMVar2 = (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
             Lib::alloc(capacity * 0x1c);
    __ptr = this->_stack;
    if (__ptr == (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)0x0) {
      this->_stack = pMVar2;
      this->_cursor = pMVar2;
      this->_capacity = capacity;
    }
    else {
      for (uVar1 = 0; uVar3 = (ulong)uVar1,
          uVar3 < (ulong)(((long)this->_cursor - (long)__ptr) / 0x1c); uVar1 = uVar1 + 1) {
        Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>::MonomFactor
                  (pMVar2 + uVar3,__ptr + uVar3);
        __ptr = this->_stack;
      }
      Lib::free(__ptr);
      this->_cursor =
           (MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_> *)
           (((long)this->_cursor - (long)this->_stack) + (long)pMVar2);
      this->_capacity = capacity;
      this->_stack = pMVar2;
    }
    this->_end = pMVar2 + capacity;
  }
  return;
}

Assistant:

inline
  void reserve(size_t capacity) 
  {
    if (_capacity >= capacity) {
      return;
    }
    C* mem = static_cast<C*>(ALLOC_KNOWN(capacity*sizeof(C),className()));
    if (_stack) {
      for (unsigned i = 0; i < size(); i++) {
        ::new(&mem[i]) C(std::move((*this)[i]));
      }
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());

      _cursor = mem + (_cursor - _stack);
      _capacity = capacity;
      _stack = mem;
      _end = _stack + _capacity;
    } else {
      _stack = mem;
      _cursor = mem;
      _capacity = capacity;
      _end = _stack + _capacity;
    }
  }